

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O3

string * __thiscall
cnn::InputNode::as_string
          (string *__return_storage_ptr__,InputNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  ostringstream s;
  char local_191;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"constant(",9);
  poVar1 = operator<<((ostream *)local_190,&this->dim);
  local_191 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string InputNode::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "constant(" << dim << ')';
  return s.str();
}